

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenFaceNormalsProcess.cpp
# Opt level: O2

bool __thiscall
Assimp::GenFaceNormalsProcess::GenMeshFaceNormals(GenFaceNormalsProcess *this,aiMesh *pMesh)

{
  aiFace *paVar1;
  uint uVar2;
  float fVar3;
  aiVector3D *paVar4;
  uint *puVar5;
  float fVar6;
  float fVar7;
  uint i_1;
  uint uVar8;
  aiVector3D *paVar9;
  aiVector3t<float> *paVar10;
  Logger *this_00;
  uint i;
  ulong uVar11;
  ulong uVar12;
  aiVector3D vNor;
  aiVector3t<float> local_60;
  aiVector3t<float> local_50;
  aiVector3t<float> local_40;
  
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if (this->force_ != true) {
      return false;
    }
    operator_delete__(pMesh->mNormals);
  }
  if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Normal vectors are undefined for line and point meshes");
    return false;
  }
  uVar8 = pMesh->mNumVertices;
  uVar12 = (ulong)uVar8 * 0xc;
  paVar9 = (aiVector3D *)operator_new__(uVar12);
  if ((ulong)uVar8 != 0) {
    uVar12 = uVar12 - 0xc;
    memset(paVar9,0,(uVar12 - uVar12 % 0xc) + 0xc);
  }
  pMesh->mNormals = paVar9;
  for (uVar12 = 0; uVar12 < pMesh->mNumFaces; uVar12 = uVar12 + 1) {
    paVar1 = pMesh->mFaces + uVar12;
    uVar8 = pMesh->mFaces[uVar12].mNumIndices;
    if (uVar8 < 3) {
      for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
        paVar4 = pMesh->mNormals;
        uVar8 = paVar1->mIndices[uVar11];
        paVar9 = paVar4 + uVar8;
        paVar9->x = NAN;
        paVar9->y = NAN;
        paVar4[uVar8].z = NAN;
        uVar8 = paVar1->mNumIndices;
      }
    }
    else {
      paVar9 = pMesh->mVertices;
      puVar5 = paVar1->mIndices;
      uVar2 = *puVar5;
      uVar8 = puVar5[uVar8 - 1];
      local_50 = operator-(paVar9 + puVar5[1],paVar9 + uVar2);
      local_60 = operator-(paVar9 + uVar8,paVar9 + uVar2);
      local_40 = operator^(&local_50,&local_60);
      paVar10 = aiVector3t<float>::NormalizeSafe(&local_40);
      fVar6 = paVar10->x;
      fVar7 = paVar10->y;
      fVar3 = paVar10->z;
      for (uVar11 = 0; uVar11 < paVar1->mNumIndices; uVar11 = uVar11 + 1) {
        paVar9 = pMesh->mNormals;
        uVar8 = paVar1->mIndices[uVar11];
        paVar9[uVar8].z = fVar3;
        paVar9 = paVar9 + uVar8;
        paVar9->x = fVar6;
        paVar9->y = fVar7;
      }
    }
  }
  return true;
}

Assistant:

bool GenFaceNormalsProcess::GenMeshFaceNormals (aiMesh* pMesh)
{
    if (NULL != pMesh->mNormals) {
        if (force_) delete[] pMesh->mNormals;
        else return false;
    }

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))   {
        ASSIMP_LOG_INFO("Normal vectors are undefined for line and point meshes");
        return false;
    }

    // allocate an array to hold the output normals
    pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    const float qnan = get_qnan();

    // iterate through all faces and compute per-face normals but store them per-vertex.
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)   {
            // either a point or a line -> no well-defined normal vector
            for (unsigned int i = 0;i < face.mNumIndices;++i) {
                pMesh->mNormals[face.mIndices[i]] = aiVector3D(qnan);
            }
            continue;
        }

        const aiVector3D* pV1 = &pMesh->mVertices[face.mIndices[0]];
        const aiVector3D* pV2 = &pMesh->mVertices[face.mIndices[1]];
        const aiVector3D* pV3 = &pMesh->mVertices[face.mIndices[face.mNumIndices-1]];
        const aiVector3D vNor = ((*pV2 - *pV1) ^ (*pV3 - *pV1)).NormalizeSafe();

        for (unsigned int i = 0;i < face.mNumIndices;++i) {
            pMesh->mNormals[face.mIndices[i]] = vNor;
        }
    }
    return true;
}